

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

double Logger::log(double __x)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  uint in_EDI;
  char *__s;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  string label;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (in_EDI < 4) {
    __s = &DAT_0024bcd8 + *(int *)(&DAT_0024bcd8 + (ulong)in_EDI * 4);
  }
  else {
    __s = "DETAIL";
    if (in_EDI == 4) {
      __s = "DEBUG";
    }
  }
  local_38 = local_28;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,__s,__s + sVar3);
  if ((int)in_EDI < 3) {
    poVar4 = (ostream *)&std::cerr;
  }
  else {
    poVar4 = (ostream *)&std::cout;
  }
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  dVar5 = extraout_XMM0_Qa;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
    dVar5 = extraout_XMM0_Qa_00;
  }
  return dVar5;
}

Assistant:

static std::ostream & log(Logger::Level::Type level)
    {
        std::string label = (level==Logger::Level::FATAL  ? "FATAL":
                            (level==Logger::Level::ERROR  ? "ERROR":
                            (level==Logger::Level::WARNING? "WARNING":
                            (level==Logger::Level::INFO   ? "INFO":
                            (level==Logger::Level::DEBUG  ? "DEBUG":"DETAIL")))));
        std::ostream * os = (level <= Logger::Level::WARNING ? &std::cerr : &std::cout);
        *os << std::left << std::setw(7) << label << ": ";
        return *os;
    }